

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

ssize_t __thiscall
trial::protocol::buffer::basic_container<std::vector<char,_std::allocator<char>_>_>::write
          (basic_container<std::vector<char,_std::allocator<char>_>_> *this,int __fd,void *__buf,
          size_t __n)

{
  vector<char,std::allocator<char>> *this_00;
  uint uVar1;
  size_type sVar2;
  undefined4 extraout_var;
  const_iterator __first;
  const_iterator __last;
  iterator iVar3;
  undefined4 in_register_00000034;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  const_iterator local_20;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  view_type *view_local;
  basic_container<std::vector<char,_std::allocator<char>_>_> *this_local;
  
  local_18 = (basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(in_register_00000034,__fd)
  ;
  view_local = (view_type *)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_18);
  uVar1 = (*(this->super_base<char>)._vptr_base[2])(this,sVar2);
  iVar3._M_current = (char *)CONCAT44(extraout_var,uVar1);
  if ((uVar1 & 1) != 0) {
    this_00 = (vector<char,std::allocator<char>> *)this->buffer;
    local_28._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(this->buffer);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_20,
               &local_28);
    __first = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_18);
    __last = std::basic_string_view<char,_std::char_traits<char>_>::end(local_18);
    iVar3 = std::vector<char,std::allocator<char>>::insert<char_const*,void>
                      (this_00,local_20,__first,__last);
  }
  return (ssize_t)iVar3._M_current;
}

Assistant:

virtual void write(const view_type& view)
    {
        if (grow(view.size()))
        {
            buffer.insert(buffer.end(), view.begin(), view.end());
        }
    }